

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

natwm_error string_split(char *string,char delimiter,char ***result,size_t *length)

{
  long lVar1;
  size_t list;
  _Bool _Var2;
  natwm_error nVar3;
  char *data;
  char **ppcVar4;
  long *plVar5;
  char **ppcVar6;
  int iVar7;
  undefined8 *puVar8;
  char *local_48;
  char *item;
  size_t delimiter_pos;
  
  delimiter_pos = (size_t)list_create();
  if ((list *)delimiter_pos == (list *)0x0) {
    return MEMORY_ALLOCATION_ERROR;
  }
  do {
    local_48 = (char *)0x0;
    item = (char *)0x0;
    nVar3 = string_get_delimiter(string,delimiter,&local_48,(size_t *)&item,false);
    if (nVar3 == NO_ERROR) {
      list_insert((list *)delimiter_pos,local_48);
      string = string + (long)item + 1;
      iVar7 = 0;
      item = item + 1;
    }
    else {
      iVar7 = 4;
      if ((nVar3 == NOT_FOUND_ERROR) && (data = string_init(string), data != (char *)0x0)) {
        list_insert((list *)delimiter_pos,data);
        iVar7 = 2;
      }
    }
    list = delimiter_pos;
  } while (iVar7 == 0);
  if (iVar7 != 4) {
    _Var2 = list_is_empty((list *)delimiter_pos);
    if (_Var2) {
      return NOT_FOUND_ERROR;
    }
    lVar1 = *(long *)(list + 0x10);
    ppcVar4 = (char **)malloc(lVar1 * 8);
    if (ppcVar4 != (char **)0x0) {
      plVar5 = *(long **)list;
      if (plVar5 != (long *)0x0) {
        ppcVar6 = ppcVar4 + lVar1;
        do {
          ppcVar6 = ppcVar6 + -1;
          *ppcVar6 = (char *)plVar5[2];
          plVar5 = (long *)*plVar5;
        } while (plVar5 != (long *)0x0);
      }
      *result = ppcVar4;
      *length = *(size_t *)(list + 0x10);
      nVar3 = NO_ERROR;
      goto LAB_0010b661;
    }
  }
  for (puVar8 = *(undefined8 **)list; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
    if ((void *)puVar8[2] != (void *)0x0) {
      free((void *)puVar8[2]);
    }
  }
LAB_0010b661:
  list_destroy((list *)list);
  return nVar3;
}

Assistant:

enum natwm_error string_split(const char *string, char delimiter, char ***result, size_t *length)
{
        // We will create a list of each item we find, then push them all
        // into an array once we find the total number
        struct list *found_items = list_create();

        if (found_items == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        enum natwm_error err = GENERIC_ERROR;

        for (;;) {
                char *item = NULL;
                size_t delimiter_pos = 0;
                err = string_get_delimiter(string, delimiter, &item, &delimiter_pos, false);

                if (err == NOT_FOUND_ERROR) {
                        // There are no more delimiters in the string, but we
                        // still need to consume the last item
                        char *last_item = string_init(string);

                        if (last_item == NULL) {
                                goto free_and_error;
                        }

                        list_insert(found_items, last_item);

                        break;
                } else if (err != NO_ERROR) {
                        // We have an actual error
                        goto free_and_error;
                }

                list_insert(found_items, item);

                string += ++delimiter_pos;
        }

        if (list_is_empty(found_items)) {
                return NOT_FOUND_ERROR;
        }

        // We should now have a list of items. We can now make an array of them
        char **items = malloc(sizeof(char *) * found_items->size);

        if (items == NULL) {
                goto free_and_error;
        }

        // Walk the list backwards to store the strings in order
        size_t items_index = (found_items->size - 1);

        LIST_FOR_EACH(found_items, item)
        {
                items[items_index] = (char *)item->data;

                --items_index;
        }

        *result = items;
        *length = found_items->size;

        // We have no need for this list anymore
        list_destroy(found_items);

        return NO_ERROR;

free_and_error:
        // We need to make sure to cleanup any memory allocated while finding
        // items before we return an error
        LIST_FOR_EACH(found_items, item)
        {
                if (item && item->data != NULL) {
                        free((char *)item->data);
                }
        }

        list_destroy(found_items);

        return err;
}